

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

string * dlib::cast_to_string<long>(string *__return_storage_ptr__,long *item)

{
  undefined8 *puVar1;
  ostringstream sout;
  long local_190 [4];
  byte abStack_170 [80];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::ostream::_M_insert<long>((long)local_190);
  if ((abStack_170[*(long *)(local_190[0] + -0x18)] & 5) == 0) {
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base(local_120);
    return __return_storage_ptr__;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  puVar1[1] = puVar1 + 3;
  puVar1[2] = 0;
  *(undefined1 *)(puVar1 + 3) = 0;
  *(undefined4 *)(puVar1 + 5) = 0x1d;
  *puVar1 = &PTR__error_001fa5e0;
  __cxa_throw(puVar1,&cast_to_string_error::typeinfo,error::~error);
}

Assistant:

const std::string cast_to_string (
        const T& item 
    )
    {
        std::ostringstream sout;
        sout << item;
        if (!sout)
            throw cast_to_string_error();
        return sout.str();
    }